

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorSwapElements(ZyanVector *vector,ZyanUSize index_first,ZyanUSize index_second)

{
  void *__dest;
  void *__src;
  void *__src_00;
  ZyanU64 *b;
  ZyanU64 *a;
  ZyanU64 *t;
  ZyanUSize index_second_local;
  ZyanUSize index_first_local;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    vector_local._4_4_ = 0x80100004;
  }
  else if ((index_first < vector->size) && (index_second < vector->size)) {
    if (vector->size == vector->capacity) {
      vector_local._4_4_ = 0x80100009;
    }
    else {
      if (vector->element_size == 0) {
        __assert_fail("vector->element_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x227,"ZyanStatus ZyanVectorSwapElements(ZyanVector *, ZyanUSize, ZyanUSize)"
                     );
      }
      if (vector->data == (void *)0x0) {
        __assert_fail("vector->data",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x228,"ZyanStatus ZyanVectorSwapElements(ZyanVector *, ZyanUSize, ZyanUSize)"
                     );
      }
      __dest = (void *)((long)vector->data + vector->size * vector->element_size);
      __src = (void *)((long)vector->data + index_first * vector->element_size);
      __src_00 = (void *)((long)vector->data + index_second * vector->element_size);
      memcpy(__dest,__src,vector->element_size);
      memcpy(__src,__src_00,vector->element_size);
      memcpy(__src_00,__dest,vector->element_size);
      vector_local._4_4_ = 0x100000;
    }
  }
  else {
    vector_local._4_4_ = 0x80100008;
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorSwapElements(ZyanVector* vector, ZyanUSize index_first, ZyanUSize index_second)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index_first >= vector->size) || (index_second >= vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (vector->size == vector->capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    ZyanU64* const t = ZYCORE_VECTOR_OFFSET(vector, vector->size);
    ZyanU64* const a = ZYCORE_VECTOR_OFFSET(vector, index_first);
    ZyanU64* const b = ZYCORE_VECTOR_OFFSET(vector, index_second);
    ZYAN_MEMCPY(t, a, vector->element_size);
    ZYAN_MEMCPY(a, b, vector->element_size);
    ZYAN_MEMCPY(b, t, vector->element_size);

    return ZYAN_STATUS_SUCCESS;
}